

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O1

void duckdb_mbedtls::MbedTlsWrapper::ToBase16(char *in,char *out,size_t len)

{
  byte bVar1;
  size_t sVar2;
  
  if (len != 0) {
    sVar2 = 0;
    do {
      bVar1 = in[sVar2];
      out[sVar2 * 2] = "0123456789ABCDEF0123456789abcdef"[(ulong)(bVar1 >> 4) + 0x10];
      out[sVar2 * 2 + 1] = "0123456789ABCDEF0123456789abcdef"[(ulong)(bVar1 & 0xf) + 0x10];
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  return;
}

Assistant:

void MbedTlsWrapper::ToBase16(char *in, char *out, size_t len) {
	static char const HEX_CODES[] = "0123456789abcdef";
	size_t i, j;

	for (j = i = 0; i < len; i++) {
		int a = in[i];
		out[j++] = HEX_CODES[(a >> 4) & 0xf];
		out[j++] = HEX_CODES[a & 0xf];
	}
}